

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTcPrsNode * __thiscall
CTcParser::parse_for_in_clause(CTcParser *this,CTcPrsNode *lval,CTPNForIn **head,CTPNForIn **tail)

{
  int iVar1;
  int iVar2;
  CTPNForIn *pCVar3;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTPNForIn *pCVar5;
  CTPNForIn *pCVar6;
  int iVar7;
  CTPNForIn **ppCVar8;
  CTcPrsNode *siz;
  
  siz = lval;
  pCVar3 = (CTPNForIn *)parse_asi_expr(this);
  if (pCVar3 == (CTPNForIn *)0x0) {
LAB_00203827:
    pCVar5 = (CTPNForIn *)0x0;
  }
  else {
    if ((G_tok->curtok_).typ_ == TOKT_DOTDOT) {
      CTcTokenizer::next(G_tok);
      pCVar4 = parse_asi_expr(this);
      if (pCVar4 == (CTcPrsNode *)0x0) goto LAB_00203827;
      if ((((G_tok->curtok_).typ_ == TOKT_SYM) && ((G_tok->curtok_).text_len_ == 4)) &&
         (*(int *)(G_tok->curtok_).text_ == 0x70657473)) {
        CTcTokenizer::next(G_tok);
        pCVar6 = (CTPNForIn *)parse_asi_expr(this);
      }
      else {
        pCVar6 = (CTPNForIn *)0x0;
      }
      iVar2 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar4);
      iVar1 = -1;
      iVar7 = -1;
      if (CONCAT44(extraout_var,iVar2) == 0) {
        iVar7 = this->local_cnt_;
        if (this->max_local_cnt_ <= iVar7) {
          this->max_local_cnt_ = iVar7 + 1;
        }
        this->local_cnt_ = iVar7 + 1;
      }
      if (pCVar6 != (CTPNForIn *)0x0) {
        iVar2 = (*(pCVar6->super_CTPNForInBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                  _vptr_CTcPrsNodeBase[1])(pCVar6);
        if (CONCAT44(extraout_var_00,iVar2) == 0) {
          iVar1 = this->local_cnt_;
          if (this->max_local_cnt_ <= iVar1) {
            this->max_local_cnt_ = iVar1 + 1;
          }
          this->local_cnt_ = iVar1 + 1;
        }
      }
      pCVar5 = (CTPNForIn *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x38,(size_t)siz);
      (pCVar5->super_CTPNForInBase).nxt_ = (CTPNForIn *)0x0;
      pCVar5[1].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)lval;
      pCVar5[1].super_CTPNForInBase.nxt_ = pCVar3;
      pCVar5[2].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)pCVar4;
      pCVar5[2].super_CTPNForInBase.nxt_ = pCVar6;
      *(int *)&pCVar5[3].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase.
               _vptr_CTcPrsNodeBase = iVar7;
      *(int *)((long)&pCVar5[3].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                      _vptr_CTcPrsNodeBase + 4) = iVar1;
      (pCVar5->super_CTPNForInBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_0031a868;
    }
    else {
      pCVar5 = (CTPNForIn *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)siz);
      iVar7 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar7) {
        this->max_local_cnt_ = iVar7 + 1;
      }
      this->local_cnt_ = iVar7 + 1;
      (pCVar5->super_CTPNForInBase).nxt_ = (CTPNForIn *)0x0;
      pCVar5[1].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)lval;
      pCVar5[1].super_CTPNForInBase.nxt_ = pCVar3;
      *(int *)&pCVar5[2].super_CTPNForInBase.super_CTcPrsNode.super_CTcPrsNodeBase.
               _vptr_CTcPrsNodeBase = iVar7;
      (pCVar5->super_CTPNForInBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR_gen_code_0031a760;
    }
    ppCVar8 = &((*tail)->super_CTPNForInBase).nxt_;
    if (*tail == (CTPNForIn *)0x0) {
      ppCVar8 = head;
    }
    *ppCVar8 = pCVar5;
    *tail = pCVar5;
  }
  return (CTcPrsNode *)pCVar5;
}

Assistant:

CTcPrsNode *CTcParser::parse_for_in_clause(
    CTcPrsNode *lval, CTPNForIn *&head, CTPNForIn *&tail)
{
    /* 
     *   Parse an assignment expression.  We parse from this point in the
     *   grammar because the entire 'in' clause can be part of a comma
     *   expression, so we want to stop if we reach a comma rather than
     *   treating the comma as part of our own expression.  
     */
    CTcPrsNode *expr = parse_asi_expr();

    /* if that failed, return failure */
    if (expr == 0)
        return 0;

    /* if the next token is "..", we have a "for var in from..to" range */
    CTPNForIn *in_expr;
    if (G_tok->cur() == TOKT_DOTDOT)
    {
        /* skip the ".." and parse the "to" expression */
        G_tok->next();
        CTcPrsNode *toExpr = parse_asi_expr();

        /* if that failed, return failure */
        if (toExpr == 0)
            return 0;

        /* check for the optional "step" expression */
        CTcPrsNode *stepExpr = 0;
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("step", 4))
        {
            /* skip the "step" and parse the expression */
            G_tok->next();
            stepExpr = parse_asi_expr();
        }

        /* 
         *   allocate variables for the "to" and "step" expressions, but only
         *   if they're non-constant 
         */
        int to_local = (toExpr->is_const() ? -1 : alloc_local());
        int step_local = (stepExpr == 0 || stepExpr->is_const() ? -1 :
                          alloc_local());

        /* build the "for x in range" node */
        in_expr = new CTPNVarInRange(lval, expr, toExpr, stepExpr,
                                     to_local, step_local);
    }
    else
    {
        /* it's a plain old "for x in collection" */
        in_expr = new CTPNVarIn(lval, expr, alloc_local());
    }

    /* link it into the list */
    if (tail != 0)
        tail->setnxt(in_expr);
    else
        head = in_expr;
    tail = in_expr;

    /* return the new expression */
    return in_expr;
}